

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idw.cc
# Opt level: O3

void __thiscall gmath::IDWNode::IDWNode(IDWNode *this,uint _x,uint _y,uint _s,IDWNode *_child)

{
  uint uVar1;
  float fVar2;
  InvalidArgumentException *pIVar3;
  bool bVar4;
  double dVar5;
  undefined1 auVar6 [16];
  string local_40;
  
  if ((_x % _s != 0) || (_y % _s != 0)) {
    pIVar3 = (InvalidArgumentException *)__cxa_allocate_exception(0x28);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"IDWNode: Illegal location","");
    gutil::InvalidArgumentException::InvalidArgumentException(pIVar3,&local_40);
    __cxa_throw(pIVar3,&gutil::InvalidArgumentException::typeinfo,gutil::Exception::~Exception);
  }
  if ((((_x <= _child->x) && (_child->x < _s + _x)) && (_y <= _child->y)) && (_child->y < _s + _y))
  {
    this->x = _x;
    this->y = _y;
    this->s = _s;
    this->r2 = (float)(_s * _s * 0x19);
    auVar6._4_4_ = 0;
    auVar6._0_4_ = _x;
    auVar6._8_4_ = _y;
    auVar6._12_4_ = 0;
    auVar6 = auVar6 | _DAT_0011f540;
    dVar5 = DAT_0011f540._8_8_;
    this->xs = (float)_s * 0.5 + (float)(auVar6._0_8_ - (double)DAT_0011f540) + -0.5;
    this->ys = (float)_s * 0.5 + (float)(auVar6._8_8_ - dVar5) + -0.5;
    this->child[0] = (IDWNode *)0x0;
    this->child[1] = (IDWNode *)0x0;
    this->child[2] = (IDWNode *)0x0;
    this->child[3] = (IDWNode *)0x0;
    bVar4 = (_s >> 1) + _y <= _child->y;
    uVar1 = bVar4 + 1 + (uint)bVar4;
    if (_child->x < _x + (_s >> 1)) {
      uVar1 = (uint)bVar4 * 2;
    }
    this->child[uVar1] = _child;
    this->n = _child->n;
    fVar2 = _child->w;
    this->f = _child->f;
    this->w = fVar2;
    return;
  }
  pIVar3 = (InvalidArgumentException *)__cxa_allocate_exception(0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"IDWNode: Child is not covered by parent","");
  gutil::InvalidArgumentException::InvalidArgumentException(pIVar3,&local_40);
  __cxa_throw(pIVar3,&gutil::InvalidArgumentException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

IDWNode::IDWNode(unsigned int _x, unsigned int _y, unsigned int _s, IDWNode *_child)
{
  // sanity checks

  if (_x/_s*_s != _x || _y/_s*_s != _y)
  {
    throw gutil::InvalidArgumentException(std::string("IDWNode: Illegal location"));
  }

  if (_child->x < _x || _child->x >= _x+_s || _child->y < _y || _child->y >= _y+_s)
  {
    throw gutil::InvalidArgumentException(std::string("IDWNode: Child is not covered by parent"));
  }

  x=_x;
  y=_y;
  s=_s;

  r2=static_cast<float>(25*s*s);
  xs=x+0.5f*s-0.5f;
  ys=y+0.5f*s-0.5f;

  // add child

  child[0]=0;
  child[1]=0;
  child[2]=0;
  child[3]=0;

  int i;
  if (_child->x < x+(s>>1))
  {
    i=2;
    if (_child->y < y+(s>>1))
    {
      i=0;
    }
  }
  else
  {
    i=3;
    if (_child->y < y+(s>>1))
    {
      i=1;
    }
  }

  child[i]=_child;

  // take data from child as data of this node

  n=_child->n;
  f=_child->f;
  w=_child->w;
}